

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::SingleArena_CopyConstructEmpty_Test::TestBody
          (SingleArena_CopyConstructEmpty_Test *this)

{
  bool bVar1;
  pointer arena_00;
  string *lhs;
  char *pcVar2;
  char *in_R9;
  string local_c0;
  AssertHelper local_a0;
  Message local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  Message local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  ArenaStringPtr dst;
  ArenaStringPtr field;
  undefined1 local_38 [8];
  unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> arena;
  string empty;
  SingleArena_CopyConstructEmpty_Test *this_local;
  
  std::__cxx11::string::string((string *)&arena);
  SingleArena::GetArena((SingleArena *)local_38);
  internal::ArenaStringPtr::InitExternal(&dst,(string *)&arena);
  arena_00 = std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
             ::get((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
                    *)local_38);
  internal::ArenaStringPtr::ArenaStringPtr((ArenaStringPtr *)&gtest_ar.message_,arena_00,&dst);
  lhs = internal::ArenaStringPtr::Get_abi_cxx11_((ArenaStringPtr *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[1],_nullptr>
            ((EqHelper *)local_68,"dst.Get()","\"\"",lhs,(char (*) [1])(anon_var_dwarf_37cdd0 + 5));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_89 = internal::ArenaStringPtr::IsDefault((ArenaStringPtr *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,(internal *)local_88,(AssertionResult *)"dst.IsDefault()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  bVar1 = std::operator==((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
                           *)local_38,(nullptr_t)0x0);
  if (bVar1) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&gtest_ar.message_);
  }
  internal::ArenaStringPtr::Destroy(&dst);
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> *)
              local_38);
  std::__cxx11::string::~string((string *)&arena);
  return;
}

Assistant:

TEST_P(SingleArena, CopyConstructEmpty) {
  std::string empty;
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitExternal(&empty);

  ArenaStringPtr dst(arena.get(), field);
  EXPECT_EQ(dst.Get(), "");
  if (internal::DebugHardenForceCopyDefaultString()) {
    EXPECT_FALSE(dst.IsDefault());
  } else {
    EXPECT_TRUE(dst.IsDefault());
  }
  if (arena == nullptr) dst.Destroy();
  field.Destroy();
}